

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O0

void graph_displace(t_gobj *z,_glist *glist,int dx,int dy)

{
  int iVar1;
  _glist *x;
  int dy_local;
  int dx_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  if ((*(ushort *)&z[0xe].g_next >> 8 & 1) == 0) {
    text_displace(z,glist,dx,dy);
  }
  else {
    *(short *)&z[2].g_next = *(short *)&z[2].g_next + (short)dx;
    *(short *)((long)&z[2].g_next + 2) = *(short *)((long)&z[2].g_next + 2) + (short)dy;
    iVar1 = glist_isvisible(glist);
    if (iVar1 != 0) {
      glist_redraw((_glist *)z);
      canvas_fixlinesfor(glist,(t_text *)z);
    }
  }
  return;
}

Assistant:

static void graph_displace(t_gobj *z, t_glist *glist, int dx, int dy)
{
    t_glist *x = (t_glist *)z;
    if (!x->gl_isgraph)
        text_widgetbehavior.w_displacefn(z, glist, dx, dy);
    else
    {
        x->gl_obj.te_xpix += dx;
        x->gl_obj.te_ypix += dy;
        if (glist_isvisible(glist)) {
            glist_redraw(x);
            canvas_fixlinesfor(glist, &x->gl_obj);
        }
    }
}